

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ticks_linear.c
# Opt level: O1

void mpt_ticks_linear(mpt_dpoint *pts,size_t nt,double dx,double dy)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  
  if ((nt != 0) && (lVar5 = nt - 1, lVar5 != 0)) {
    dVar1 = pts->x;
    dVar2 = pts->y;
    dVar3 = pts[1].x;
    dVar4 = pts[1].y;
    auVar7._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar7._0_8_ = lVar5;
    auVar7._12_4_ = 0x45300000;
    dVar8 = (auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
    sVar6 = 1;
    do {
      auVar10._8_4_ = (int)(sVar6 >> 0x20);
      auVar10._0_8_ = sVar6;
      auVar10._12_4_ = 0x45300000;
      dVar11 = (auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0);
      dVar9 = (dx / dVar8) * dVar11;
      dVar11 = dVar11 * (dy / dVar8);
      pts->x = dVar1 + dVar9;
      pts->y = dVar2 + dVar11;
      pts[1].x = dVar9 + dVar3;
      pts[1].y = dVar11 + dVar4;
      pts = pts + 2;
      sVar6 = sVar6 + 1;
    } while (nt != sVar6);
  }
  return;
}

Assistant:

extern void mpt_ticks_linear(MPT_STRUCT(dpoint) *pts, size_t nt, double dx, double dy)
{
	double bx, by, tx, ty;
	size_t i;
	
	if (!nt--) {
		return;
	}
	/* tick base */
	bx = pts[0].x;
	by = pts[0].y;
	/* tick end */
	tx = pts[1].x;
	ty = pts[1].y;
	
	/* tick difference */
	dx = dx / nt;
	dy = dy / nt;
	
	/* set tick data */
	for (i = 1; i <= nt; i++) {
		double x = i * dx, y = i * dy;
		
		pts[0].x = bx + x;
		pts[0].y = by + y;
		pts[1].x = tx + x;
		pts[1].y = ty + y;
		
		pts += 2;
	}
}